

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_cde37::DepsLogTestRecompact::Run(DepsLogTestRecompact *this)

{
  Test *pTVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  LoadStatus LVar5;
  Node *pNVar6;
  Deps *pDVar7;
  Node *node;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  StringPiece path_03;
  StringPiece path_04;
  StringPiece path_05;
  StringPiece path_06;
  StringPiece path_07;
  StringPiece path_08;
  StringPiece path_09;
  StringPiece path_10;
  StringPiece path_11;
  StringPiece path_12;
  string err;
  vector<Node_*,_std::allocator<Node_*>_> deps;
  stat st;
  DepsLog log;
  State state;
  char kManifest [75];
  string local_2d8;
  vector<Node_*,_std::allocator<Node_*>_> local_2b8;
  Node *local_298;
  Node *local_290;
  int local_284;
  undefined1 local_280 [16];
  Node local_270;
  DepsLog local_1f0;
  State local_190;
  char local_88 [72];
  undefined2 local_40;
  undefined1 local_3e;
  
  pcVar9 = "rule cc\n  command = cc\n  deps = gcc\nbuild out.o: cc\nbuild other_out.o: cc\n";
  pcVar10 = local_88;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined8 *)pcVar10 = *(undefined8 *)pcVar9;
    pcVar9 = pcVar9 + 8;
    pcVar10 = pcVar10 + 8;
  }
  local_3e = 0;
  local_40 = 0xa63;
  State::State(&local_190);
  iVar4 = g_current_test->assertion_failures_;
  AssertParse(&local_190,local_88,(ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  if (iVar4 == g_current_test->assertion_failures_) {
    local_1f0.file_path_._M_dataplus._M_p = (pointer)&local_1f0.file_path_.field_2;
    local_1f0.needs_recompaction_ = false;
    local_1f0.file_ = (FILE *)0x0;
    local_1f0.file_path_._M_string_length = 0;
    local_1f0.file_path_.field_2._M_local_buf[0] = '\0';
    local_1f0.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f0.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f0.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f0.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f0.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f0.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2d8._M_string_length = 0;
    local_2d8.field_2._M_local_buf[0] = '\0';
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    local_280._0_8_ = &local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"DepsLogTest-tempfile","");
    bVar2 = DepsLog::OpenForWrite(&local_1f0,(string *)local_280,&local_2d8);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0xbb,"log.OpenForWrite(kTestFilename, &err)");
    if ((Node *)local_280._0_8_ != &local_270) {
      operator_delete((void *)local_280._0_8_,(ulong)(local_270.path_._M_dataplus._M_p + 1));
    }
    pTVar1 = g_current_test;
    if (bVar2) {
      iVar4 = std::__cxx11::string::compare((char *)&local_2d8);
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xbc,"\"\" == err");
      if (!bVar2) {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        goto LAB_001511bd;
      }
      local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      path.len_ = 5;
      path.str_ = "foo.h";
      local_280._0_8_ = State::GetNode(&local_190,path,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&local_2b8,(Node **)local_280);
      path_00.len_ = 5;
      path_00.str_ = "bar.h";
      local_280._0_8_ = State::GetNode(&local_190,path_00,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&local_2b8,(Node **)local_280);
      path_01.len_ = 5;
      path_01.str_ = "out.o";
      pNVar6 = State::GetNode(&local_190,path_01,0);
      DepsLog::RecordDeps(&local_1f0,pNVar6,1,&local_2b8);
      if (local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      path_02.len_ = 5;
      path_02.str_ = "foo.h";
      local_280._0_8_ = State::GetNode(&local_190,path_02,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&local_2b8,(Node **)local_280);
      path_03.len_ = 5;
      path_03.str_ = "baz.h";
      local_280._0_8_ = State::GetNode(&local_190,path_03,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&local_2b8,(Node **)local_280);
      path_04.len_ = 0xb;
      path_04.str_ = "other_out.o";
      pNVar6 = State::GetNode(&local_190,path_04,0);
      DepsLog::RecordDeps(&local_1f0,pNVar6,1,&local_2b8);
      DepsLog::Close(&local_1f0);
      pTVar1 = g_current_test;
      iVar4 = stat("DepsLogTest-tempfile",(stat *)local_280);
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xcb,"0 == stat(kTestFilename, &st)");
      if (bVar2) {
        local_298 = (Node *)CONCAT44(local_298._4_4_,(int)local_270.slash_bits_);
        bVar3 = testing::Test::Check
                          (g_current_test,0 < (int)local_270.slash_bits_,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                           ,0xcd,"file_size > 0");
        bVar2 = true;
        if (!bVar3) goto LAB_00151186;
      }
      else {
LAB_00151186:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        bVar2 = false;
      }
      if (local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_001511bd:
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,
                      CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                               local_2d8.field_2._M_local_buf[0]) + 1);
    }
    DepsLog::~DepsLog(&local_1f0);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    bVar2 = false;
  }
  if (local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_190.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d6ce0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_190.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_190.bindings_.bindings_._M_t);
  if (local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_190.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_190);
  if (!bVar2) {
    return;
  }
  State::State(&local_190);
  iVar4 = g_current_test->assertion_failures_;
  AssertParse(&local_190,local_88,(ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  if (iVar4 == g_current_test->assertion_failures_) {
    local_1f0.file_path_._M_dataplus._M_p = (pointer)&local_1f0.file_path_.field_2;
    local_1f0.needs_recompaction_ = false;
    local_1f0.file_ = (FILE *)0x0;
    local_1f0.file_path_._M_string_length = 0;
    local_1f0.file_path_.field_2._M_local_buf[0] = '\0';
    local_1f0.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f0.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f0.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f0.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f0.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f0.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2d8._M_string_length = 0;
    local_2d8.field_2._M_local_buf[0] = '\0';
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    local_280._0_8_ = &local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"DepsLogTest-tempfile","");
    LVar5 = DepsLog::Load(&local_1f0,(string *)local_280,&local_190,&local_2d8);
    bVar2 = testing::Test::Check
                      (pTVar1,LVar5 != LOAD_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0xd7,"log.Load(kTestFilename, &state, &err)");
    if ((Node *)local_280._0_8_ != &local_270) {
      operator_delete((void *)local_280._0_8_,(ulong)(local_270.path_._M_dataplus._M_p + 1));
    }
    pTVar1 = g_current_test;
    if (bVar2) {
      local_280._0_8_ = &local_270;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"DepsLogTest-tempfile","")
      ;
      bVar2 = DepsLog::OpenForWrite(&local_1f0,(string *)local_280,&local_2d8);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xd9,"log.OpenForWrite(kTestFilename, &err)");
      if ((Node *)local_280._0_8_ != &local_270) {
        operator_delete((void *)local_280._0_8_,(ulong)(local_270.path_._M_dataplus._M_p + 1));
      }
      pTVar1 = g_current_test;
      if (!bVar2) goto LAB_0015152f;
      iVar4 = std::__cxx11::string::compare((char *)&local_2d8);
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xda,"\"\" == err");
      if (!bVar2) {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        goto LAB_00151532;
      }
      local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      path_05.len_ = 5;
      path_05.str_ = "foo.h";
      local_280._0_8_ = State::GetNode(&local_190,path_05,0);
      std::vector<Node*,std::allocator<Node*>>::emplace_back<Node*>
                ((vector<Node*,std::allocator<Node*>> *)&local_2b8,(Node **)local_280);
      path_06.len_ = 5;
      path_06.str_ = "out.o";
      pNVar6 = State::GetNode(&local_190,path_06,0);
      DepsLog::RecordDeps(&local_1f0,pNVar6,1,&local_2b8);
      DepsLog::Close(&local_1f0);
      pTVar1 = g_current_test;
      iVar4 = stat("DepsLogTest-tempfile",(stat *)local_280);
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xe2,"0 == stat(kTestFilename, &st)");
      if (bVar2) {
        local_284 = (int)local_270.slash_bits_;
        bVar3 = testing::Test::Check
                          (g_current_test,(int)local_298 < (int)local_270.slash_bits_,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                           ,0xe5,"file_size_2 > file_size");
        bVar2 = true;
        if (!bVar3) goto LAB_00151504;
      }
      else {
LAB_00151504:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        bVar2 = false;
      }
      if (local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
LAB_0015152f:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00151532:
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,
                      CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                               local_2d8.field_2._M_local_buf[0]) + 1);
    }
    DepsLog::~DepsLog(&local_1f0);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    bVar2 = false;
  }
  if (local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_190.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d6ce0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_190.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_190.bindings_.bindings_._M_t);
  if (local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_190.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_190);
  if (!bVar2) {
    return;
  }
  State::State(&local_190);
  iVar4 = g_current_test->assertion_failures_;
  AssertParse(&local_190,local_88,(ManifestParserOptions)0x0);
  pTVar1 = g_current_test;
  if (iVar4 == g_current_test->assertion_failures_) {
    local_1f0.file_path_._M_dataplus._M_p = (pointer)&local_1f0.file_path_.field_2;
    local_1f0.needs_recompaction_ = false;
    local_1f0.file_ = (FILE *)0x0;
    local_1f0.file_path_._M_string_length = 0;
    local_1f0.file_path_.field_2._M_local_buf[0] = '\0';
    local_1f0.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f0.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f0.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f0.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f0.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f0.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2d8._M_string_length = 0;
    local_2d8.field_2._M_local_buf[0] = '\0';
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    local_280._0_8_ = &local_270;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"DepsLogTest-tempfile","");
    LVar5 = DepsLog::Load(&local_1f0,(string *)local_280,&local_190,&local_2d8);
    bVar2 = testing::Test::Check
                      (pTVar1,LVar5 != LOAD_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0xf0,"log.Load(kTestFilename, &state, &err)");
    if ((Node *)local_280._0_8_ != &local_270) {
      operator_delete((void *)local_280._0_8_,(ulong)(local_270.path_._M_dataplus._M_p + 1));
    }
    if (bVar2) {
      path_07.len_ = 5;
      path_07.str_ = "out.o";
      pNVar6 = State::GetNode(&local_190,path_07,0);
      pDVar7 = DepsLog::GetDeps(&local_1f0,pNVar6);
      bVar2 = testing::Test::Check
                        (g_current_test,pDVar7 != (Deps *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xf4,"deps");
      if ((!bVar2) ||
         (bVar2 = testing::Test::Check
                            (g_current_test,pDVar7->mtime == 1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                             ,0xf5,"1 == deps->mtime"), !bVar2)) goto LAB_00151c94;
      bVar2 = testing::Test::Check
                        (g_current_test,pDVar7->node_count == 1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xf6,"1 == deps->node_count");
      pTVar1 = g_current_test;
      local_298 = pNVar6;
      if (!bVar2) goto LAB_00152307;
      iVar4 = std::__cxx11::string::compare((char *)*pDVar7->nodes);
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xf7,"\"foo.h\" == deps->nodes[0]->path()");
      if (!bVar2) goto LAB_00151c8b;
      path_08.len_ = 0xb;
      path_08.str_ = "other_out.o";
      pNVar6 = State::GetNode(&local_190,path_08,0);
      pDVar7 = DepsLog::GetDeps(&local_1f0,pNVar6);
      bVar2 = testing::Test::Check
                        (g_current_test,pDVar7 != (Deps *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xfb,"deps");
      if ((!bVar2) ||
         (bVar2 = testing::Test::Check
                            (g_current_test,pDVar7->mtime == 1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                             ,0xfc,"1 == deps->mtime"), !bVar2)) goto LAB_00151c94;
      bVar2 = testing::Test::Check
                        (g_current_test,pDVar7->node_count == 2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xfd,"2 == deps->node_count");
      pTVar1 = g_current_test;
      local_290 = pNVar6;
      if (!bVar2) {
LAB_00152323:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        goto LAB_00151c97;
      }
      iVar4 = std::__cxx11::string::compare((char *)*pDVar7->nodes);
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xfe,"\"foo.h\" == deps->nodes[0]->path()");
      pTVar1 = g_current_test;
      if (!bVar2) goto LAB_00152323;
      iVar4 = std::__cxx11::string::compare((char *)pDVar7->nodes[1]);
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0xff,"\"baz.h\" == deps->nodes[1]->path()");
      pTVar1 = g_current_test;
      if (!bVar2) goto LAB_00152307;
      local_280._0_8_ = &local_270;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"DepsLogTest-tempfile","")
      ;
      bVar2 = DepsLog::Recompact(&local_1f0,(string *)local_280,&local_2d8);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x101,"log.Recompact(kTestFilename, &err)");
      if ((Node *)local_280._0_8_ != &local_270) {
        operator_delete((void *)local_280._0_8_,(ulong)(local_270.path_._M_dataplus._M_p + 1));
      }
      if (!bVar2) goto LAB_00151c8b;
      pDVar7 = DepsLog::GetDeps(&local_1f0,local_298);
      bVar2 = testing::Test::Check
                        (g_current_test,pDVar7 != (Deps *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x105,"deps");
      if ((!bVar2) ||
         (bVar2 = testing::Test::Check
                            (g_current_test,pDVar7->mtime == 1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                             ,0x106,"1 == deps->mtime"), !bVar2)) {
LAB_00151c94:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        goto LAB_00151c97;
      }
      bVar2 = testing::Test::Check
                        (g_current_test,pDVar7->node_count == 1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x107,"1 == deps->node_count");
      pTVar1 = g_current_test;
      if (!bVar2) goto LAB_00152323;
      iVar4 = std::__cxx11::string::compare((char *)*pDVar7->nodes);
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x108,"\"foo.h\" == deps->nodes[0]->path()");
      if (!bVar2) goto LAB_00151c94;
      bVar2 = testing::Test::Check
                        (g_current_test,
                         local_298 ==
                         local_1f0.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[local_298->id_],
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x109,"out == log.nodes()[out->id()]");
      if (!bVar2) goto LAB_00151c8b;
      pDVar7 = DepsLog::GetDeps(&local_1f0,local_290);
      bVar2 = testing::Test::Check
                        (g_current_test,pDVar7 != (Deps *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x10c,"deps");
      if ((!bVar2) ||
         (bVar2 = testing::Test::Check
                            (g_current_test,pDVar7->mtime == 1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                             ,0x10d,"1 == deps->mtime"), !bVar2)) goto LAB_00151c94;
      bVar2 = testing::Test::Check
                        (g_current_test,pDVar7->node_count == 2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x10e,"2 == deps->node_count");
      pTVar1 = g_current_test;
      if (!bVar2) {
LAB_00152307:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        goto LAB_00151c97;
      }
      iVar4 = std::__cxx11::string::compare((char *)*pDVar7->nodes);
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x10f,"\"foo.h\" == deps->nodes[0]->path()");
      pTVar1 = g_current_test;
      if (!bVar2) goto LAB_00152307;
      iVar4 = std::__cxx11::string::compare((char *)pDVar7->nodes[1]);
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x110,"\"baz.h\" == deps->nodes[1]->path()");
      if (!bVar2) goto LAB_00151c94;
      bVar2 = testing::Test::Check
                        (g_current_test,
                         local_290 ==
                         local_1f0.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[local_290->id_],
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x111,"other_out == log.nodes()[other_out->id()]");
      pTVar1 = g_current_test;
      if (!bVar2) goto LAB_00151c8b;
      iVar4 = stat("DepsLogTest-tempfile",(stat *)local_280);
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x115,"0 == stat(kTestFilename, &st)");
      if (bVar2) {
        local_290 = (Node *)CONCAT44(local_290._4_4_,(int)local_270.slash_bits_);
        bVar3 = testing::Test::Check
                          (g_current_test,(int)local_270.slash_bits_ < local_284,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                           ,0x117,"file_size_3 < file_size_2");
        bVar2 = true;
        if (!bVar3) goto LAB_00151c75;
      }
      else {
LAB_00151c75:
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        bVar2 = false;
      }
    }
    else {
LAB_00151c8b:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00151c97:
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,
                      CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                               local_2d8.field_2._M_local_buf[0]) + 1);
    }
    DepsLog::~DepsLog(&local_1f0);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    bVar2 = false;
  }
  if (local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_190.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d6ce0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_190.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_190.bindings_.bindings_._M_t);
  if (local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_190.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_190);
  if (!bVar2) {
    return;
  }
  State::State(&local_190);
  pTVar1 = g_current_test;
  local_1f0.file_path_._M_dataplus._M_p = (pointer)&local_1f0.file_path_.field_2;
  local_1f0.needs_recompaction_ = false;
  local_1f0.file_ = (FILE *)0x0;
  local_1f0.file_path_._M_string_length = 0;
  local_1f0.file_path_.field_2._M_local_buf[0] = '\0';
  local_1f0.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f0.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  local_280._0_8_ = &local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"DepsLogTest-tempfile","");
  LVar5 = DepsLog::Load(&local_1f0,(string *)local_280,&local_190,&local_2d8);
  bVar2 = testing::Test::Check
                    (pTVar1,LVar5 != LOAD_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x121,"log.Load(kTestFilename, &state, &err)");
  if ((Node *)local_280._0_8_ != &local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270.path_._M_dataplus._M_p + 1));
  }
  if (!bVar2) {
LAB_00152249:
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_00152255;
  }
  path_09.len_ = 5;
  path_09.str_ = "out.o";
  pNVar6 = State::GetNode(&local_190,path_09,0);
  pDVar7 = DepsLog::GetDeps(&local_1f0,pNVar6);
  bVar2 = testing::Test::Check
                    (g_current_test,pDVar7 != (Deps *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x125,"deps");
  if ((!bVar2) ||
     (bVar2 = testing::Test::Check
                        (g_current_test,pDVar7->mtime == 1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x126,"1 == deps->mtime"), !bVar2)) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_00152255;
  }
  bVar2 = testing::Test::Check
                    (g_current_test,pDVar7->node_count == 1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x127,"1 == deps->node_count");
  pTVar1 = g_current_test;
  if (!bVar2) {
LAB_00152310:
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_00152255;
  }
  iVar4 = std::__cxx11::string::compare((char *)*pDVar7->nodes);
  bVar2 = testing::Test::Check
                    (pTVar1,iVar4 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x128,"\"foo.h\" == deps->nodes[0]->path()");
  if (!bVar2) goto LAB_00152249;
  path_10.len_ = 0xb;
  path_10.str_ = "other_out.o";
  node = State::GetNode(&local_190,path_10,0);
  pDVar7 = DepsLog::GetDeps(&local_1f0,node);
  bVar2 = testing::Test::Check
                    (g_current_test,pDVar7 != (Deps *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,300,"deps");
  if ((!bVar2) ||
     (bVar2 = testing::Test::Check
                        (g_current_test,pDVar7->mtime == 1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x12d,"1 == deps->mtime"), !bVar2)) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    goto LAB_00152255;
  }
  bVar2 = testing::Test::Check
                    (g_current_test,pDVar7->node_count == 2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                     ,0x12e,"2 == deps->node_count");
  pTVar1 = g_current_test;
  local_298 = node;
  if (bVar2) {
    iVar4 = std::__cxx11::string::compare((char *)*pDVar7->nodes);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar4 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                       ,0x12f,"\"foo.h\" == deps->nodes[0]->path()");
    pTVar1 = g_current_test;
    if (bVar2) {
      iVar4 = std::__cxx11::string::compare((char *)pDVar7->nodes[1]);
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x130,"\"baz.h\" == deps->nodes[1]->path()");
      pTVar1 = g_current_test;
      if (!bVar2) goto LAB_00152310;
      local_280._0_8_ = &local_270;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"DepsLogTest-tempfile","")
      ;
      bVar2 = DepsLog::Recompact(&local_1f0,(string *)local_280,&local_2d8);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                         ,0x132,"log.Recompact(kTestFilename, &err)");
      if ((Node *)local_280._0_8_ != &local_270) {
        operator_delete((void *)local_280._0_8_,(ulong)(local_270.path_._M_dataplus._M_p + 1));
      }
      if (bVar2) {
        pDVar7 = DepsLog::GetDeps(&local_1f0,pNVar6);
        bVar2 = testing::Test::Check
                          (g_current_test,pDVar7 == (Deps *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                           ,0x136,"deps");
        if (bVar2) {
          pDVar7 = DepsLog::GetDeps(&local_1f0,local_298);
          bVar2 = testing::Test::Check
                            (g_current_test,pDVar7 == (Deps *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                             ,0x139,"deps");
          pTVar1 = g_current_test;
          if (bVar2) {
            path_11.len_ = 5;
            path_11.str_ = "foo.h";
            pNVar6 = State::LookupNode(&local_190,path_11);
            bVar2 = testing::Test::Check
                              (pTVar1,pNVar6->id_ == -1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                               ,0x13c,"-1 == state.LookupNode(\"foo.h\")->id()");
            pTVar1 = g_current_test;
            if (bVar2) {
              path_12.len_ = 5;
              path_12.str_ = "baz.h";
              pNVar6 = State::LookupNode(&local_190,path_12);
              bVar2 = testing::Test::Check
                                (pTVar1,pNVar6->id_ == -1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                 ,0x13d,"-1 == state.LookupNode(\"baz.h\")->id()");
              pTVar1 = g_current_test;
              if (bVar2) {
                iVar4 = stat("DepsLogTest-tempfile",(stat *)local_280);
                bVar2 = testing::Test::Check
                                  (pTVar1,iVar4 == 0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                   ,0x141,"0 == stat(kTestFilename, &st)");
                if (bVar2) {
                  bVar2 = testing::Test::Check
                                    (g_current_test,(int)local_270.slash_bits_ < (int)local_290,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/deps_log_test.cc"
                                     ,0x143,"file_size_4 < file_size_3");
                  if (bVar2) goto LAB_00152255;
                }
              }
              goto LAB_0015223d;
            }
          }
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          goto LAB_00152255;
        }
      }
LAB_0015223d:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      goto LAB_00152255;
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00152255:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,
                    CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                             local_2d8.field_2._M_local_buf[0]) + 1);
  }
  DepsLog::~DepsLog(&local_1f0);
  if (local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.defaults_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_190.bindings_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d6ce0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_190.bindings_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_190.bindings_.bindings_._M_t);
  if (local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_190.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&local_190.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_190);
  return;
}

Assistant:

TEST_F(DepsLogTest, Recompact) {
  const char kManifest[] =
"rule cc\n"
"  command = cc\n"
"  deps = gcc\n"
"build out.o: cc\n"
"build other_out.o: cc\n";

  // Write some deps to the file and grab its size.
  int file_size;
  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, kManifest));
    DepsLog log;
    string err;
    ASSERT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("bar.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);

    deps.clear();
    deps.push_back(state.GetNode("foo.h", 0));
    deps.push_back(state.GetNode("baz.h", 0));
    log.RecordDeps(state.GetNode("other_out.o", 0), 1, deps);

    log.Close();

    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    file_size = (int)st.st_size;
    ASSERT_GT(file_size, 0);
  }

  // Now reload the file, and add slightly different deps.
  int file_size_2;
  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, kManifest));
    DepsLog log;
    string err;
    ASSERT_TRUE(log.Load(kTestFilename, &state, &err));

    ASSERT_TRUE(log.OpenForWrite(kTestFilename, &err));
    ASSERT_EQ("", err);

    vector<Node*> deps;
    deps.push_back(state.GetNode("foo.h", 0));
    log.RecordDeps(state.GetNode("out.o", 0), 1, deps);
    log.Close();

    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    file_size_2 = (int)st.st_size;
    // The file should grow to record the new deps.
    ASSERT_GT(file_size_2, file_size);
  }

  // Now reload the file, verify the new deps have replaced the old, then
  // recompact.
  int file_size_3;
  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, kManifest));
    DepsLog log;
    string err;
    ASSERT_TRUE(log.Load(kTestFilename, &state, &err));

    Node* out = state.GetNode("out.o", 0);
    DepsLog::Deps* deps = log.GetDeps(out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(1, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());

    Node* other_out = state.GetNode("other_out.o", 0);
    deps = log.GetDeps(other_out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(2, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());
    ASSERT_EQ("baz.h", deps->nodes[1]->path());

    ASSERT_TRUE(log.Recompact(kTestFilename, &err));

    // The in-memory deps graph should still be valid after recompaction.
    deps = log.GetDeps(out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(1, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());
    ASSERT_EQ(out, log.nodes()[out->id()]);

    deps = log.GetDeps(other_out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(2, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());
    ASSERT_EQ("baz.h", deps->nodes[1]->path());
    ASSERT_EQ(other_out, log.nodes()[other_out->id()]);

    // The file should have shrunk a bit for the smaller deps.
    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    file_size_3 = (int)st.st_size;
    ASSERT_LT(file_size_3, file_size_2);
  }

  // Now reload the file and recompact with an empty manifest. The previous
  // entries should be removed.
  {
    State state;
    // Intentionally not parsing kManifest here.
    DepsLog log;
    string err;
    ASSERT_TRUE(log.Load(kTestFilename, &state, &err));

    Node* out = state.GetNode("out.o", 0);
    DepsLog::Deps* deps = log.GetDeps(out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(1, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());

    Node* other_out = state.GetNode("other_out.o", 0);
    deps = log.GetDeps(other_out);
    ASSERT_TRUE(deps);
    ASSERT_EQ(1, deps->mtime);
    ASSERT_EQ(2, deps->node_count);
    ASSERT_EQ("foo.h", deps->nodes[0]->path());
    ASSERT_EQ("baz.h", deps->nodes[1]->path());

    ASSERT_TRUE(log.Recompact(kTestFilename, &err));

    // The previous entries should have been removed.
    deps = log.GetDeps(out);
    ASSERT_FALSE(deps);

    deps = log.GetDeps(other_out);
    ASSERT_FALSE(deps);

    // The .h files pulled in via deps should no longer have ids either.
    ASSERT_EQ(-1, state.LookupNode("foo.h")->id());
    ASSERT_EQ(-1, state.LookupNode("baz.h")->id());

    // The file should have shrunk more.
    struct stat st;
    ASSERT_EQ(0, stat(kTestFilename, &st));
    int file_size_4 = (int)st.st_size;
    ASSERT_LT(file_size_4, file_size_3);
  }
}